

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMPTEAnalyzerResults.cpp
# Opt level: O0

void __thiscall
SMPTEAnalyzerResults::GenerateFrameTabularText
          (SMPTEAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  Frame local_f0 [40];
  char local_c8 [8];
  char str [128];
  Frame frame;
  DisplayBase display_base_local;
  U64 frame_index_local;
  SMPTEAnalyzerResults *this_local;
  
  AnalyzerResults::GetFrame((ulonglong)(str + 0x78));
  Frame::Frame(local_f0,(Frame *)(str + 0x78));
  fillSMPTE(this,local_f0,local_c8);
  Frame::~Frame(local_f0);
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::AddTabularText
            ((char *)this,local_c8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  Frame::~Frame((Frame *)(str + 0x78));
  return;
}

Assistant:

void SMPTEAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
	Frame frame = GetFrame( frame_index );
	char str[128];
	fillSMPTE(frame,str);

	ClearTabularText();
	AddTabularText( str );
}